

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O2

void __thiscall avro::ArrayParser::parse(ArrayParser *this,Reader *reader,uint8_t *address)

{
  size_t sVar1;
  size_t sVar2;
  element_type *peVar3;
  int64_t iVar4;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  
  sVar1 = this->offset_;
  sVar2 = this->setFuncOffset_;
  do {
    iVar4 = ReaderImpl<avro::NullValidator>::readSize(reader);
    lVar6 = 0;
    if (0 < iVar4) {
      lVar6 = iVar4;
    }
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      uVar5 = (**(code **)(address + sVar2))(address + sVar1);
      peVar3 = (this->resolver_).px;
      (**peVar3->_vptr_Resolver)(peVar3,reader,uVar5);
    }
  } while (iVar4 != 0);
  return;
}

Assistant:

virtual void parse(Reader &reader, uint8_t *address) const
    {
        DEBUG_OUT("Reading array");

        uint8_t *arrayAddress = address + offset_;

        GenericArraySetter* setter = reinterpret_cast<GenericArraySetter *> (address + setFuncOffset_);

        int64_t size = 0;
        do {
            size = reader.readArrayBlockSize();
            for(int64_t i = 0; i < size; ++i) {
                // create a new map entry and get the address
                uint8_t *location = (*setter)(arrayAddress);
                resolver_->parse(reader, location);
            }
        } while (size != 0);
    }